

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_legacy_abi_cxx11_
          (CompilerHLSL *this,SPIRType *type,uint32_t param_2)

{
  uint32_t id;
  SPIRType *pSVar1;
  CompilerError *this_00;
  undefined4 in_register_00000014;
  long lVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [48];
  string local_50 [8];
  string res;
  SPIRType *imagetype;
  uint32_t param_2_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  lVar2 = CONCAT44(in_register_00000014,param_2);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)(lVar2 + 0x108));
  pSVar1 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,id);
  ::std::__cxx11::string::string(local_50);
  if (pSVar1->basetype == Int) {
    ::std::__cxx11::string::operator=(local_50,"i");
  }
  else if (pSVar1->basetype == UInt) {
    ::std::__cxx11::string::operator=(local_50,"u");
  }
  if ((*(int *)(lVar2 + 0x10) == 0x10) && (*(int *)(lVar2 + 0x10c) == 6)) {
    ::std::operator+(local_80,(char *)local_50);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_80);
    ::std::__cxx11::string::~string((string *)local_80);
  }
  else {
    if ((*(int *)(lVar2 + 0x10) == 0x10) && (*(int *)(lVar2 + 0x10c) != 6)) {
      if ((*(int *)(lVar2 + 0x10c) == 5) && (*(int *)(lVar2 + 0x114) == 1)) {
        ::std::__cxx11::string::operator+=(local_50,"sampler");
      }
      else {
        pcVar3 = "texture";
        if (*(int *)(lVar2 + 0x114) == 2) {
          pcVar3 = "image";
        }
        ::std::__cxx11::string::operator+=(local_50,pcVar3);
      }
    }
    else {
      ::std::__cxx11::string::operator+=(local_50,"sampler");
    }
    switch(*(undefined4 *)(lVar2 + 0x10c)) {
    case 0:
      ::std::__cxx11::string::operator+=(local_50,"1D");
      break;
    case 1:
      ::std::__cxx11::string::operator+=(local_50,"2D");
      break;
    case 2:
      ::std::__cxx11::string::operator+=(local_50,"3D");
      break;
    case 3:
      ::std::__cxx11::string::operator+=(local_50,"CUBE");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case 5:
      ::std::__cxx11::string::operator+=(local_50,"Buffer");
      break;
    case 6:
      ::std::__cxx11::string::operator+=(local_50,"2D");
    }
    if ((*(byte *)(lVar2 + 0x112) & 1) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"MS");
    }
    if ((*(byte *)(lVar2 + 0x111) & 1) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"Array");
    }
    ::std::__cxx11::string::string((string *)this,local_50);
  }
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CompilerHLSL::image_type_hlsl_legacy(const SPIRType &type, uint32_t /*id*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
		res = "i";
		break;
	case SPIRType::UInt:
		res = "u";
		break;
	default:
		break;
	}

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "CUBE";
		break;

	case DimBuffer:
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
		res += "Array";

	return res;
}